

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpHeaders::HttpHeaders(HttpHeaders *this,HttpHeaderTable *table)

{
  uint uVar1;
  HttpHeaderTable *table_local;
  HttpHeaders *this_local;
  
  this->table = table;
  uVar1 = HttpHeaderTable::idCount(table);
  heapArray<kj::StringPtr>(&this->indexedHeaders,(ulong)uVar1);
  Vector<kj::HttpHeaders::Header>::Vector(&this->unindexedHeaders);
  Vector<kj::Array<char>_>::Vector(&this->ownedStrings);
  return;
}

Assistant:

HttpHeaders::HttpHeaders(const HttpHeaderTable& table)
    : table(&table),
      indexedHeaders(kj::heapArray<kj::StringPtr>(table.idCount())) {}